

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O2

uint ON_SubDDisplayParameters::AbsoluteDisplayDensityFromSubDFaceCount
               (uint adaptive_subd_display_density,uint subd_face_count)

{
  uint uVar1;
  uint uVar2;
  
  if (adaptive_subd_display_density < 2) {
    uVar1 = 1;
  }
  else {
    uVar1 = 4;
    if (adaptive_subd_display_density < 7) {
      uVar1 = adaptive_subd_display_density;
    }
    for (uVar2 = subd_face_count << ((char)uVar1 * '\x02' & 0x1fU); (1 < uVar1 && (0x7d000 < uVar2))
        ; uVar2 = uVar2 >> 2) {
      uVar1 = uVar1 - 1;
    }
  }
  return uVar1;
}

Assistant:

unsigned int ON_SubDDisplayParameters::AbsoluteDisplayDensityFromSubDFaceCount(
  unsigned adaptive_subd_display_density,
  unsigned subd_face_count
)
{
  // The returned density must always be >= 2 so we can reliably calculate 
  // NURBS curve forms of SubD edge curves in that begin/end at an
  // extraordinary vertex. This is done in
  // ON_SubDEdge::GetEdgeSurfaceCurveControlPoints().
  // When there is a better way to get NURBS approximations of edges that end
  // at extraordinary vertices, we can reduce min_display_density to 1.
  // 
  // 2022-06-08. Pierre, RH-62025. I have no idea why this is set to 1 when
  // ON_SubDEdge::GetEdgeSurfaceCurveControlPoints() has not changed.
  // Most of the SubD to NURBS code expects the display density to be >= 2.
  // However, setting it to 2 would force SubDs with >32k faces to be meshed
  // with a display density >= 2. Meshing and NURBSing parameters should not
  // be set in the same code!
  // I'm changing this to ON_SubDDisplayParameters::MinimumAdaptiveDensity (== 1) to 
  // have some explanation for the value, and setting an absolute display density
  // of 2 in SubD to NURBS code.
  const unsigned min_display_density = ON_SubDDisplayParameters::MinimumAdaptiveDensity; // adaptive cutoff

#if 1
  if (adaptive_subd_display_density <= min_display_density)
    // 2022-06-08. Pierre, RH-62025. This used to return adaptive_subd_display_density,
    // completely obviating the point of min_display_density.
    return min_display_density;
  if (adaptive_subd_display_density > ON_SubDDisplayParameters::MaximumDensity)
    adaptive_subd_display_density = ON_SubDDisplayParameters::DefaultDensity;

  const unsigned max_mesh_quad_count = ON_SubDDisplayParameters::AdaptiveDisplayMeshQuadMaximum;
  unsigned absolute_display_density = adaptive_subd_display_density;
  unsigned mesh_quad_count = (1 << (2 * absolute_display_density)) * subd_face_count;
  while (absolute_display_density > min_display_density && mesh_quad_count > max_mesh_quad_count)
  {
    --absolute_display_density;
    mesh_quad_count /= 4;
  }
  return absolute_display_density;
#else

#if !defined(ON_DEBUG)
  // This insures an accidental commit will never get merged.
#error NEVER COMMIT THIS CODE!
#endif

  // used to test contanst densities when debugging.
  return min_display_density;
  //return 3;
  //return ON_SubDDisplayParameters::DefaultDensity;

#endif
}